

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

char * __thiscall bodyArg::extract(bodyArg *this,char *buf,int32_t *ofs,int32_t *len)

{
  int iVar1;
  size_t sVar2;
  
  if (this->str == (char *)0x0) {
    if (this->strbuf == (CVmObjStringBuffer *)0x0) {
      if (this->bytarr == (CVmObjByteArray *)0x0) {
        if (this->file == (CVmObjFile *)0x0) {
          *len = 0;
        }
        else {
          (*this->datasource->_vptr_CVmDataSource[8])(this->datasource,(long)*ofs,0);
          iVar1 = (*this->datasource->_vptr_CVmDataSource[3])(this->datasource,buf,(long)*len);
          *len = iVar1;
          *ofs = *ofs + iVar1;
        }
      }
      else {
        sVar2 = CVmObjByteArray::copy_to_buf(this->bytarr,(uchar *)buf,(long)*ofs + 1,(long)*len);
        *len = (int)sVar2;
        *ofs = *ofs + (int)sVar2;
      }
    }
    else {
      CVmObjStringBuffer::to_utf8(this->strbuf,buf,ofs,len);
    }
  }
  else {
    if (this->len < *len) {
      *len = this->len;
    }
    buf = this->str + *ofs;
    *ofs = *len + *ofs;
  }
  return buf;
}

Assistant:

const char *extract(char *buf, int32_t &ofs, int32_t &len)
    {
        /* assume we'll have to copy into the caller's buffer */
        const char *ret = buf;

        /* determine what to do based on the source type */
        if (str != 0)
        {
            /* limit the length to the actual source length */
            if (len > this->len)
                len = this->len;

            /* get a pointer to the requested substring */
            ret = str + ofs;

            /* move the offset past the requested portion */
            ofs += len;
        }
        else if (strbuf != 0)
        {
            /* 
             *   for a string buffer, we have to translate to utf8 - this
             *   updates 'idx' and 'len' per our interface
             */
            strbuf->to_utf8(buf, ofs, len);
        }
        else if (bytarr != 0)
        {
            /* 
             *   It's a byte array - copy bytes to the caller's buffer.  Note
             *   that we use 0-based offsets, and the byte array uses 1-based
             *   offsets, so adjust accordingly. 
             */
            len = bytarr->copy_to_buf((unsigned char *)buf, ofs + 1, len);

            /* adjust the offset for the actual copied size */
            ofs += len;
        }
        else if (file != 0)
        {
            /* 
             *   It's a File object - read bytes from the file into the
             *   caller's buffer. 
             */
            datasource->seek(ofs, OSFSK_SET);
            len = datasource->readc(buf, len);

            /* adjust the offset for the actual copied size */
            ofs += len;
        }
        else
        {
            /* didn't read anything */
            len = 0;
        }

        /* return the result pointer */
        return ret;
    }